

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O0

__pid_t __thiscall lzham::semaphore::wait(semaphore *this,void *__stat_loc)

{
  int *piVar1;
  int *extraout_RAX;
  timespec interval;
  int status;
  uint in_stack_000001c4;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  timespec local_28;
  uint local_18;
  int local_14;
  semaphore *local_10;
  undefined1 local_1;
  
  local_14 = (int)__stat_loc;
  local_10 = this;
  if (local_14 == -1) {
    local_18 = sem_wait((sem_t *)this);
  }
  else {
    local_28.tv_sec = ((ulong)__stat_loc & 0xffffffff) / 1000;
    local_28.tv_nsec = (((ulong)__stat_loc & 0xffffffff) % 1000) * 1000000;
    local_18 = sem_timedwait((sem_t *)this,&local_28);
  }
  piVar1 = (int *)(ulong)local_18;
  if (local_18 == 0) {
    local_1 = 1;
  }
  else {
    piVar1 = __errno_location();
    if (*piVar1 != 0x6e) {
      lzham_fail(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4);
      piVar1 = extraout_RAX;
    }
    local_1 = 0;
  }
  return (__pid_t)CONCAT71((int7)((ulong)piVar1 >> 8),local_1);
}

Assistant:

inline bool wait(uint32 milliseconds = UINT32_MAX)
      {
         int status;
         if (milliseconds == UINT32_MAX)
         {
            status = sem_wait(&m_sem);
         }
         else
         {
            struct timespec interval;
            interval.tv_sec = milliseconds / 1000;
            interval.tv_nsec = (milliseconds % 1000) * 1000000L;
            status = sem_timedwait(&m_sem, &interval);
         }

         if (status)
         {
            if (errno != ETIMEDOUT)
            {
               LZHAM_FAIL("semaphore: sem_wait() or sem_timedwait() failed");
            }
            return false;
         }

         return true;
      }